

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeFunction * __thiscall
ExpressionContext::GetFunctionType
          (ExpressionContext *this,SynBase *source,TypeBase *returnType,
          IntrusiveList<TypeHandle> arguments)

{
  TypeBase *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  TypeHandle *pTVar3;
  uint hash;
  InplaceStr name;
  TypeFunction *result;
  TypeFunction *local_38;
  TypeFunction *this_00;
  
  pTVar3 = arguments.head;
  if (returnType != (TypeBase *)0x0) {
    if (returnType->typeID - 0x1a < 3) {
      __assert_fail("!isType<TypeArgumentSet>(returnType) && !isType<TypeMemberSet>(returnType) && !isType<TypeFunctionSet>(returnType)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x74d,
                    "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, IntrusiveList<TypeHandle>)"
                   );
    }
    if (returnType->typeID == 0) {
      __assert_fail("!isType<TypeError>(returnType)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x74e,
                    "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, IntrusiveList<TypeHandle>)"
                   );
    }
  }
  hash = returnType->nameHash;
  do {
    if (pTVar3 == (TypeHandle *)0x0) {
      result = GetFunctionTypeFromCache(&this->functionTypeMap,hash,returnType,arguments);
      if (result == (TypeFunction *)0x0) {
        iVar2 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x78);
        this_00 = (TypeFunction *)CONCAT44(extraout_var,iVar2);
        name = GetFunctionTypeName(this,returnType,arguments);
        TypeFunction::TypeFunction(this_00,name,returnType,arguments);
        result = this_00;
        if (0x2000 < (uint)(*(int *)&(this_00->super_TypeBase).name.end -
                           *(int *)&(this_00->super_TypeBase).name.begin)) {
          Stop(this,source,"ERROR: generated function type name exceeds maximum type length \'%d\'",
               0x2000);
        }
        (this_00->super_TypeBase).alignment = 4;
        SmallArray<TypeFunction_*,_128U>::push_back(&this->functionTypes,&result);
        local_38 = result;
        SmallArray<TypeBase_*,_128U>::push_back(&this->types,(TypeBase **)&local_38);
        DirectChainedMap<TypeFunction_*>::insert(&this->functionTypeMap,hash,result);
      }
      return result;
    }
    pTVar1 = pTVar3->type;
    if (pTVar1 != (TypeBase *)0x0) {
      if (pTVar1->typeID - 0x1a < 3) {
        __assert_fail("!isType<TypeArgumentSet>(curr->type) && !isType<TypeMemberSet>(curr->type) && !isType<TypeFunctionSet>(curr->type)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x754,
                      "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, IntrusiveList<TypeHandle>)"
                     );
      }
      if (pTVar1->typeID == 0) {
        __assert_fail("!isType<TypeError>(curr->type)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x755,
                      "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, IntrusiveList<TypeHandle>)"
                     );
      }
    }
    if (pTVar1 == this->typeAuto) {
      __assert_fail("curr->type != typeAuto",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x758,
                    "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, IntrusiveList<TypeHandle>)"
                   );
    }
    hash = hash * 3 + pTVar1->nameHash;
    pTVar3 = pTVar3->next;
  } while( true );
}

Assistant:

TypeFunction* ExpressionContext::GetFunctionType(SynBase *source, TypeBase* returnType, IntrusiveList<TypeHandle> arguments)
{
	// Can't derive from pseudo types
	assert(!isType<TypeArgumentSet>(returnType) && !isType<TypeMemberSet>(returnType) && !isType<TypeFunctionSet>(returnType));
	assert(!isType<TypeError>(returnType));

	unsigned hash = returnType->nameHash;

	for(TypeHandle *curr = arguments.head; curr; curr = curr->next)
	{
		assert(!isType<TypeArgumentSet>(curr->type) && !isType<TypeMemberSet>(curr->type) && !isType<TypeFunctionSet>(curr->type));
		assert(!isType<TypeError>(curr->type));

		// Can't have auto as argument
		assert(curr->type != typeAuto);

		hash = (hash << 1) + hash + curr->type->nameHash;
	}

	if(TypeFunction *prev = GetFunctionTypeFromCache(functionTypeMap, hash, returnType, arguments))
		return prev;

	// Create new type
	TypeFunction* result = new (get<TypeFunction>()) TypeFunction(GetFunctionTypeName(*this, returnType, arguments), returnType, arguments);

	if(result->name.length() > NULLC_MAX_TYPE_NAME_LENGTH)
		Stop(source, "ERROR: generated function type name exceeds maximum type length '%d'", NULLC_MAX_TYPE_NAME_LENGTH);

	result->alignment = 4;

	functionTypes.push_back(result);
	types.push_back(result);

	functionTypeMap.insert(hash, result);

	return result;
}